

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIEnvironment::removeFont(CGUIEnvironment *this,IGUIFont *font)

{
  int *piVar1;
  IGUIFont *pIVar2;
  _func_int *p_Var3;
  pointer pSVar4;
  ulong uVar5;
  long lVar6;
  
  if (font != (IGUIFont *)0x0) {
    pSVar4 = (this->Fonts).m_data.
             super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->Fonts).m_data.
                   super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 3) *
            -0x71c71c71c71c71c7;
    if ((int)uVar5 != 0) {
      lVar6 = 0;
      do {
        pIVar2 = *(IGUIFont **)((long)&pSVar4->Font + lVar6);
        if (pIVar2 == font) {
          p_Var3 = pIVar2->_vptr_IGUIFont[-3];
          piVar1 = (int *)(&pIVar2->field_0x10 + (long)p_Var3);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (**(code **)(*(long *)((long)&pIVar2->_vptr_IGUIFont + (long)p_Var3) + 8))();
            pSVar4 = (this->Fonts).m_data.
                     super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          std::
          vector<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
          ::_M_erase(&(this->Fonts).m_data,(SFont *)((long)&(pSVar4->NamedPath).Path + lVar6));
          return;
        }
        lVar6 = lVar6 + 0x48;
      } while ((uVar5 & 0xffffffff) * 0x48 != lVar6);
    }
  }
  return;
}

Assistant:

void CGUIEnvironment::removeFont(IGUIFont *font)
{
	if (!font)
		return;
	for (u32 i = 0; i < Fonts.size(); ++i) {
		if (Fonts[i].Font == font) {
			Fonts[i].Font->drop();
			Fonts.erase(i);
			return;
		}
	}
}